

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O0

void ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  __mbstate_t this;
  bool bVar1;
  uchar value;
  byte bVar2;
  byte bVar3;
  difference_type dVar4;
  uint output_position;
  uint second_byte;
  uint first_byte;
  uint count;
  uint distance;
  anon_class_16_2_3e1545d2 PopDescriptorBit;
  BitField<decltype(input)> descriptor_bits;
  undefined1 auStack_28 [4];
  uint descriptor_bits_remaining;
  pos_type output_start_position;
  DecompressorOutput<std::basic_ofstream<char>_&> *output_local;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input_local;
  
  output_start_position._M_state = (__mbstate_t)output;
  _auStack_28 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
                ::Tell(&output->
                        super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                      );
  descriptor_bits._20_4_ =
       InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ::ReadLE16((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   *)input);
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader((Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            *)&PopDescriptorBit.descriptor_bits,input);
  _count = (uint *)&descriptor_bits.field_0x14;
  PopDescriptorBit.descriptor_bits_remaining = (uint *)&PopDescriptorBit.descriptor_bits;
  while (descriptor_bits._20_4_ != 0) {
    bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
            ::anon_class_16_2_3e1545d2::operator()((anon_class_16_2_3e1545d2 *)&count);
    this = output_start_position._M_state;
    if (bVar1) {
      value = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
      ::Write((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
               *)this,value);
    }
    else {
      bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
              ::anon_class_16_2_3e1545d2::operator()((anon_class_16_2_3e1545d2 *)&count);
      if (bVar1) {
        bVar3 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)input);
        bVar2 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)input);
        first_byte = ((uint)bVar3 | (bVar2 & 0xe0) << 3) + 1;
        second_byte = (bVar2 & 0x1f) + 3;
      }
      else {
        bVar3 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)input);
        first_byte = 0x100 - bVar3;
        second_byte = 2;
        bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
                ::anon_class_16_2_3e1545d2::operator()((anon_class_16_2_3e1545d2 *)&count);
        if (bVar1) {
          second_byte = 4;
        }
        bVar1 = Decompress<std::basic_ifstream<char,_std::char_traits<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_&>
                ::anon_class_16_2_3e1545d2::operator()((anon_class_16_2_3e1545d2 *)&count);
        if (bVar1) {
          second_byte = second_byte + 1;
        }
      }
      dVar4 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
              ::Distance((OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                          *)output_start_position._M_state,(pos_type *)auStack_28);
      if ((uint)dVar4 < first_byte) {
        OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>_>
        ::Fill((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>_>
                *)output_start_position._M_state,'\0',second_byte);
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>::
        Copy((DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>
              *)output_start_position._M_state,first_byte,second_byte);
      }
    }
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				const auto output_start_position = output.Tell();

				unsigned int descriptor_bits_remaining = input.ReadLE16();

				BitField<decltype(input)> descriptor_bits(input);

				const auto PopDescriptorBit = [&]()
				{
					--descriptor_bits_remaining;
					return descriptor_bits.Pop();
				};

				while (descriptor_bits_remaining != 0)
				{
					if (PopDescriptorBit())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						unsigned int distance, count;

						if (PopDescriptorBit())
						{
							const unsigned int first_byte = input.Read();
							const unsigned int second_byte = input.Read();

							distance = (first_byte | ((second_byte << 3) & 0x700)) + 1;
							count = (second_byte & 0x1F) + 3;
						}
						else
						{
							distance = 0x100 - input.Read();
							count = 2;

							if (PopDescriptorBit())
								count += 2;
							if (PopDescriptorBit())
								count += 1;
						}

						const unsigned int output_position = output.Distance(output_start_position);

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}